

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
                 *this,Index target,Index eventIndex)

{
  undefined1 *puVar1;
  pointer pIVar2;
  Zp_field_operators<unsigned_int,_void> *this_00;
  node_ptr plVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
  *targetColumn;
  Column_support *pCVar8;
  uint local_48;
  Index local_44;
  pointer local_40;
  long local_38;
  
  uVar5 = (ulong)target;
  local_40 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_38 = uVar5 * 0x38;
  pCVar8 = &local_40[uVar5].column_;
  local_40 = local_40 + uVar5;
  local_44 = target;
  while( true ) {
    puVar1 = *(undefined1 **)&(pCVar8->super_type).data_.root_plus_size_;
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
    if ((Column_support *)puVar1 != pCVar8 && puVar1 != (undefined1 *)0x0) {
      uVar7 = *(uint *)&(*(node_ptr *)((long)&(local_40->column_).super_type.data_ + 8))[1].next_;
    }
    if (uVar7 != 0xffffffff) {
      uVar6 = (this->pivotToColumnIndex_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
    }
    if ((uVar7 == 0xffffffff) || (uVar6 == 0xffffffff)) break;
    pIVar2 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = *(undefined1 **)&pIVar2[uVar6].column_.super_type.data_.root_plus_size_;
    uVar7 = 0;
    if ((Column_support *)puVar1 != &pIVar2[uVar6].column_ && puVar1 != (undefined1 *)0x0) {
      uVar7 = *(uint *)((long)&pIVar2[uVar6].column_.super_type.data_.root_plus_size_.m_header.
                               super_node.prev_[-1].prev_ + 4);
    }
    this_00 = this->operators_;
    if (this_00->characteristic_ <= uVar7) {
      uVar7 = uVar7 % this_00->characteristic_;
    }
    targetColumn = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
                    *)((long)&(pIVar2->super_Row_access_option).columnIndex_ + local_38);
    local_48 = (this_00->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
    plVar3 = (targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    iVar4 = 0;
    if (plVar3 != (node_ptr)&targetColumn->column_ && plVar3 != (node_ptr)0x0) {
      iVar4 = *(int *)((long)&(targetColumn->column_).super_type.data_.root_plus_size_.m_header.
                              super_node.prev_[-1].prev_ + 4);
    }
    persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
              (this_00,&local_48,this_00->characteristic_ - iVar4);
    _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false>>>>
              (&local_48,pIVar2 + uVar6,targetColumn);
    pIVar2 = (this->mirrorMatrixU_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false>>>>
              (&local_48,pIVar2 + uVar6,
               (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
                *)((long)&(pIVar2->super_Row_access_option).columnIndex_ + local_38));
  }
  if (uVar7 != 0xffffffff) {
    (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar7] = local_44;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}